

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::linkInterfaces(CoreBroker *this,ActionMessage *command)

{
  byte *pbVar1;
  ushort uVar2;
  size_t sVar3;
  byte *pbVar4;
  GlobalHandle GVar5;
  pointer pcVar6;
  InterfaceHandle IVar7;
  BasicHandleInfo *pBVar8;
  string *psVar9;
  action_t newAction;
  string_view alias;
  string_view target;
  string_view target_00;
  string_view endpoint;
  string_view endpoint_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view interfaceName;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view source;
  string_view source_00;
  string_view filter;
  string_view filter_00;
  ActionMessage error;
  
  switch(command->messageAction) {
  case cmd_data_link:
    name._M_str = (char *)(command->payload).heap;
    name._M_len = (command->payload).bufferSize;
    pBVar8 = HandleManager::getInterfaceHandle(&this->handles,name,PUBLICATION);
    psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
    pbVar4 = (byte *)(psVar9->_M_dataplus)._M_p;
    sVar3 = psVar9->_M_string_length;
    if (pBVar8 == (BasicHandleInfo *)0x0) {
      name_03._M_str = (char *)pbVar4;
      name_03._M_len = sVar3;
      pBVar8 = HandleManager::getInterfaceHandle(&this->handles,name_03,INPUT);
      if (pBVar8 == (BasicHandleInfo *)0x0) {
        if ((this->super_BrokerBase).field_0x294 == '\x01') {
          sVar3 = (command->payload).bufferSize;
          pbVar4 = (command->payload).heap;
          psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
          target_00._M_str = (psVar9->_M_dataplus)._M_p;
          target_00._M_len = psVar9->_M_string_length;
          source_00._M_str = (char *)pbVar4;
          source_00._M_len = sVar3;
          UnknownHandleManager::addDataLink(&this->unknownHandles,source_00,target_00);
          return;
        }
LAB_00334be9:
        routeMessage(this,command);
        return;
      }
      newAction = cmd_add_named_publication;
    }
    else {
      if ((command->payload).heap == pbVar4) {
        (command->payload).bufferSize = sVar3;
      }
      else {
        SmallBuffer::reserve(&command->payload,sVar3);
        (command->payload).bufferSize = sVar3;
        if (sVar3 != 0) {
          memcpy((command->payload).heap,pbVar4,sVar3);
        }
      }
      newAction = cmd_add_named_input;
    }
    break;
  default:
    return;
  case cmd_filter_link:
    name_01._M_str = (char *)(command->payload).heap;
    name_01._M_len = (command->payload).bufferSize;
    pBVar8 = HandleManager::getInterfaceHandle(&this->handles,name_01,FILTER);
    psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
    if (pBVar8 != (BasicHandleInfo *)0x0) {
      SmallBuffer::operator=(&command->payload,psVar9);
      ActionMessage::setAction(command,cmd_add_named_endpoint);
      IVar7.hid = (pBVar8->handle).handle.hid;
      command->source_id = (GlobalFederateId)(pBVar8->handle).fed_id.gid;
      command->source_handle = (InterfaceHandle)IVar7.hid;
      if ((pBVar8->flags & 0x200) != 0) {
        pbVar1 = (byte *)((long)&command->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      goto LAB_00334ad0;
    }
    name_04._M_str = (psVar9->_M_dataplus)._M_p;
    name_04._M_len = psVar9->_M_string_length;
    pBVar8 = HandleManager::getInterfaceHandle(&this->handles,name_04,ENDPOINT);
    if (pBVar8 == (BasicHandleInfo *)0x0) {
      if ((this->super_BrokerBase).field_0x294 == '\x01') {
        uVar2 = command->flags;
        sVar3 = (command->payload).bufferSize;
        pbVar4 = (command->payload).heap;
        psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
        pcVar6 = (psVar9->_M_dataplus)._M_p;
        if ((uVar2 & 2) != 0) {
          endpoint_00._M_str = pcVar6;
          endpoint_00._M_len = psVar9->_M_string_length;
          filter_00._M_str = (char *)pbVar4;
          filter_00._M_len = sVar3;
          UnknownHandleManager::addDestinationFilterLink
                    (&this->unknownHandles,filter_00,endpoint_00);
          return;
        }
        endpoint._M_str = pcVar6;
        endpoint._M_len = psVar9->_M_string_length;
        filter._M_str = (char *)pbVar4;
        filter._M_len = sVar3;
        UnknownHandleManager::addSourceFilterLink(&this->unknownHandles,filter,endpoint);
        return;
      }
      goto LAB_00334be9;
    }
    newAction = cmd_add_named_filter;
    break;
  case cmd_endpoint_link:
    name_00._M_str = (char *)(command->payload).heap;
    name_00._M_len = (command->payload).bufferSize;
    pBVar8 = HandleManager::getInterfaceHandle(&this->handles,name_00,ENDPOINT);
    psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
    pbVar4 = (byte *)(psVar9->_M_dataplus)._M_p;
    sVar3 = psVar9->_M_string_length;
    if (pBVar8 == (BasicHandleInfo *)0x0) {
      name_02._M_str = (char *)pbVar4;
      name_02._M_len = sVar3;
      pBVar8 = HandleManager::getInterfaceHandle(&this->handles,name_02,ENDPOINT);
      if (pBVar8 == (BasicHandleInfo *)0x0) {
        if ((this->super_BrokerBase).field_0x294 == '\x01') {
          sVar3 = (command->payload).bufferSize;
          pbVar4 = (command->payload).heap;
          psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
          target._M_str = (psVar9->_M_dataplus)._M_p;
          target._M_len = psVar9->_M_string_length;
          source._M_str = (char *)pbVar4;
          source._M_len = sVar3;
          UnknownHandleManager::addEndpointLink(&this->unknownHandles,source,target);
          return;
        }
        goto LAB_00334be9;
      }
      ActionMessage::setAction(command,cmd_add_named_endpoint);
      GVar5 = pBVar8->handle;
      (command->source_id).gid = GVar5.fed_id.gid.gid;
      (command->source_handle).hid = GVar5.handle.hid.hid;
      command->counter = 0x65;
      goto LAB_00334ad0;
    }
    if ((command->payload).heap == pbVar4) {
      (command->payload).bufferSize = sVar3;
    }
    else {
      SmallBuffer::reserve(&command->payload,sVar3);
      (command->payload).bufferSize = sVar3;
      if (sVar3 != 0) {
        memcpy((command->payload).heap,pbVar4,sVar3);
      }
    }
    ActionMessage::setAction(command,cmd_add_named_endpoint);
    *(byte *)&command->flags = (byte)command->flags | 2;
    command->counter = 0x65;
    goto LAB_00334ac9;
  case cmd_add_alias:
    sVar3 = (command->payload).bufferSize;
    pbVar4 = (command->payload).heap;
    psVar9 = ActionMessage::getString_abi_cxx11_(command,0);
    alias._M_str = (psVar9->_M_dataplus)._M_p;
    alias._M_len = psVar9->_M_string_length;
    interfaceName._M_str = (char *)pbVar4;
    interfaceName._M_len = sVar3;
    HandleManager::addAlias(&this->handles,interfaceName,alias);
    if ((this->super_BrokerBase).field_0x294 != '\0') {
      return;
    }
    routeMessage(this,command,(GlobalFederateId)0x0);
    return;
  }
  ActionMessage::setAction(command,newAction);
LAB_00334ac9:
  IVar7.hid = (pBVar8->handle).handle.hid;
  command->source_id = (GlobalFederateId)(pBVar8->handle).fed_id.gid;
  command->source_handle = (InterfaceHandle)IVar7.hid;
LAB_00334ad0:
  checkForNamedInterface(this,command);
  return;
}

Assistant:

void CoreBroker::linkInterfaces(ActionMessage& command)
{
    switch (command.action()) {
        case CMD_DATA_LINK: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                command.name(command.getString(targetStringLoc));
                command.setAction(CMD_ADD_NAMED_INPUT);
                command.setSource(pub->handle);
                checkForNamedInterface(command);
            } else {
                auto* input = handles.getInterfaceHandle(command.getString(targetStringLoc),
                                                         InterfaceType::INPUT);
                if (input == nullptr) {
                    if (isRootc) {
                        unknownHandles.addDataLink(command.name(),
                                                   command.getString(targetStringLoc));
                    } else {
                        routeMessage(command);
                    }
                } else {
                    command.setAction(CMD_ADD_NAMED_PUBLICATION);
                    command.setSource(input->handle);
                    checkForNamedInterface(command);
                }
            }
        } break;
        case CMD_ENDPOINT_LINK: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                command.name(command.getString(targetStringLoc));
                command.setAction(CMD_ADD_NAMED_ENDPOINT);
                setActionFlag(command, destination_target);
                command.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                command.setSource(ept->handle);
                checkForNamedInterface(command);
            } else {
                auto* target = handles.getInterfaceHandle(command.getString(targetStringLoc),
                                                          InterfaceType::ENDPOINT);
                if (target == nullptr) {
                    if (isRootc) {
                        unknownHandles.addEndpointLink(command.name(),
                                                       command.getString(targetStringLoc));
                    } else {
                        routeMessage(command);
                    }
                } else {
                    command.setAction(CMD_ADD_NAMED_ENDPOINT);
                    command.setSource(target->handle);
                    command.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                    checkForNamedInterface(command);
                }
            }
        } break;
        case CMD_FILTER_LINK: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.payload = command.getString(targetStringLoc);
                command.setAction(CMD_ADD_NAMED_ENDPOINT);
                command.setSource(filt->handle);
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(command, clone_flag);
                }
                checkForNamedInterface(command);
            } else {
                auto* ept = handles.getInterfaceHandle(command.getString(targetStringLoc),
                                                       InterfaceType::ENDPOINT);
                if (ept == nullptr) {
                    if (isRootc) {
                        if (checkActionFlag(command, destination_target)) {
                            unknownHandles.addDestinationFilterLink(command.name(),
                                                                    command.getString(
                                                                        targetStringLoc));
                        } else {
                            unknownHandles.addSourceFilterLink(command.name(),
                                                               command.getString(targetStringLoc));
                        }
                    } else {
                        routeMessage(command);
                    }
                } else {
                    command.setAction(CMD_ADD_NAMED_FILTER);
                    command.setSource(ept->handle);
                    checkForNamedInterface(command);
                }
            }
        } break;
        case CMD_ADD_ALIAS:
            try {
                handles.addAlias(command.payload.to_string(), command.getString(targetStringLoc));
                if (!isRootc) {
                    routeMessage(std::move(command), parent_broker_id);
                }
            }
            catch (const std::runtime_error& rtError) {
                ActionMessage error(CMD_ERROR);
                error.setDestination(command.getSource());
                error.source_id = global_broker_id_local;
                error.payload = rtError.what();
                routeMessage(std::move(error));
            }
            break;
        default:
            break;
    }
}